

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O0

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
::type_string(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
              *this,string *string)

{
  undefined1 local_20 [16];
  string *string_local;
  ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)3,_(CPU::MOS6502Esque::Type)1>
  *this_local;
  
  local_20._8_8_ = string;
  string_local = (string *)this;
  std::make_unique<Utility::StringSerialiser,std::__cxx11::string_const&,bool>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20,
             (bool *)string);
  std::unique_ptr<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>::
  operator=(&this->string_serialiser_,
            (unique_ptr<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>
             *)local_20);
  std::unique_ptr<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>::
  ~unique_ptr((unique_ptr<Utility::StringSerialiser,_std::default_delete<Utility::StringSerialiser>_>
               *)local_20);
  return;
}

Assistant:

void type_string(const std::string &string) final {
			string_serialiser_ = std::make_unique<Utility::StringSerialiser>(string, true);
		}